

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bpt_helper.c
# Opt level: O1

void breakpoint_handler_x86_64(CPUState *cs)

{
  CPUX86State *env;
  _Bool _Var1;
  CPUBreakpoint *pCVar2;
  
  env = (CPUX86State *)(cs[1].tb_jmp_cache + 0xeb);
  if (cs->watchpoint_hit == (CPUWatchpoint *)0x0) {
    pCVar2 = (cs->breakpoints).tqh_first;
    if (pCVar2 != (CPUBreakpoint *)0x0) {
      do {
        if ((TranslationBlock *)pCVar2->pc == cs[1].tb_jmp_cache[0xfb]) {
          if ((pCVar2->flags & 0x20) == 0) {
            return;
          }
          check_hw_breakpoints(env,true);
          goto LAB_0050a808;
        }
        pCVar2 = (pCVar2->entry).tqe_next;
      } while (pCVar2 != (CPUBreakpoint *)0x0);
    }
  }
  else if ((cs->watchpoint_hit->flags & 0x20) != 0) {
    cs->watchpoint_hit = (CPUWatchpoint *)0x0;
    _Var1 = check_hw_breakpoints(env,false);
    if (!_Var1) {
      cpu_loop_exit_noexc_x86_64(cs);
    }
LAB_0050a808:
    raise_exception_x86_64(env,1);
  }
  return;
}

Assistant:

void breakpoint_handler(CPUState *cs)
{
    X86CPU *cpu = X86_CPU(cs);
    CPUX86State *env = &cpu->env;
    CPUBreakpoint *bp;

    if (cs->watchpoint_hit) {
        if (cs->watchpoint_hit->flags & BP_CPU) {
            cs->watchpoint_hit = NULL;
            if (check_hw_breakpoints(env, false)) {
                raise_exception(env, EXCP01_DB);
            } else {
                cpu_loop_exit_noexc(cs);
            }
        }
    } else {
        QTAILQ_FOREACH(bp, &cs->breakpoints, entry) {
            if (bp->pc == env->eip) {
                if (bp->flags & BP_CPU) {
                    check_hw_breakpoints(env, true);
                    raise_exception(env, EXCP01_DB);
                }
                break;
            }
        }
    }
}